

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::changeObjectFormat(QTextDocumentPrivate *this,QTextObject *obj,int format)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QTextDocumentPrivate *this_00;
  QTextFrame *pQVar5;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextFrame *f;
  QTextBlockGroup *b;
  int oldFormatIndex;
  int objectIndex;
  QTextUndoCommand c;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QTextFormatCollection *in_stack_ffffffffffffffa8;
  int length;
  undefined4 in_stack_ffffffffffffffb8;
  int from;
  
  from = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  beginEditBlock(in_RDI);
  iVar2 = QTextObject::objectIndex((QTextObject *)in_RDI);
  iVar3 = QTextFormatCollection::objectFormatIndex
                    (in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20));
  QTextFormatCollection::setObjectFormatIndex
            ((QTextFormatCollection *)in_RDI,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  this_00 = (QTextDocumentPrivate *)qobject_cast<QTextBlockGroup*>((QObject *)0x7d56ed);
  if (this_00 != (QTextDocumentPrivate *)0x0) {
    QTextBlockGroup::d_func((QTextBlockGroup *)0x7d5704);
    QTextBlockGroupPrivate::markBlocksDirty((QTextBlockGroupPrivate *)CONCAT44(in_EDX,iVar2));
  }
  pQVar5 = qobject_cast<QTextFrame*>((QObject *)0x7d5716);
  if (pQVar5 != (QTextFrame *)0x0) {
    iVar2 = QTextFrame::firstPosition
                      ((QTextFrame *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    length = (int)((ulong)pQVar5 >> 0x20);
    iVar4 = QTextFrame::lastPosition((QTextFrame *)CONCAT44(iVar2,in_stack_ffffffffffffff98));
    QTextFrame::firstPosition((QTextFrame *)CONCAT44(iVar2,iVar4));
    documentChange(this_00,from,length);
  }
  QTextObject::d_func((QTextObject *)0x7d57d1);
  appendUndoItem((QTextDocumentPrivate *)CONCAT44(iVar3,in_stack_ffffffffffffffb8),
                 (QTextUndoCommand *)this_00);
  endEditBlock(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::changeObjectFormat(QTextObject *obj, int format)
{
    beginEditBlock();
    int objectIndex = obj->objectIndex();
    int oldFormatIndex = formats.objectFormatIndex(objectIndex);
    formats.setObjectFormatIndex(objectIndex, format);

    QTextBlockGroup *b = qobject_cast<QTextBlockGroup *>(obj);
    if (b) {
        b->d_func()->markBlocksDirty();
    }
    QTextFrame *f = qobject_cast<QTextFrame *>(obj);
    if (f)
        documentChange(f->firstPosition(), f->lastPosition() - f->firstPosition());

    QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::GroupFormatChange, (editBlock != 0), QTextUndoCommand::MoveCursor, oldFormatIndex,
                            0, 0, obj->d_func()->objectIndex, 0);
    appendUndoItem(c);

    endEditBlock();
}